

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

void __thiscall
PhyloTree::PhyloTree
          (PhyloTree *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *leaf2NumMap)

{
  pointer pPVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  pointer this_00;
  size_type num_bits;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> partition;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> new_bitset;
  undefined1 local_c1;
  PhyloTree *local_c0;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_b8;
  pointer local_b0;
  pointer local_a8;
  shared_ptr<Bipartition> local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  ulong local_80;
  long local_78;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  local_88 = &(this->newick).field_2;
  (this->newick)._M_dataplus._M_p = (pointer)local_88;
  (this->newick)._M_string_length = 0;
  (this->newick).field_2._M_local_buf[0] = '\0';
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = &this->leaf2NumMap;
  local_c0 = this;
  local_b8 = &this->edges;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_90,leaf2NumMap);
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = (leaf2NumMap->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (leaf2NumMap->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
            (&this->edges,
             ((long)(edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  this_00 = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pPVar1 = (edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pPVar1) {
    num_bits = (long)local_b0 - (long)local_a8 >> 5;
    local_78 = num_bits + (num_bits == 0);
    local_80 = num_bits - 1;
    do {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                (&local_50,num_bits,0,(allocator<unsigned_long> *)&local_70);
      Bipartition::getPartition(&local_70,&this_00->super_Bipartition);
      uVar4 = local_80;
      lVar5 = local_78;
      uVar3 = local_70.m_num_bits;
      if (local_b0 != local_a8) {
        do {
          uVar3 = uVar3 - 1;
          uVar6 = 1L << ((byte)uVar4 & 0x3f);
          uVar7 = uVar4 >> 6;
          if ((local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0) {
            uVar6 = ~uVar6 & local_50.m_bits.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7];
          }
          else {
            uVar6 = uVar6 | local_50.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar7];
          }
          local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = uVar6;
          lVar5 = lVar5 + -1;
          uVar4 = uVar4 - 1;
        } while (lVar5 != 0);
      }
      local_a0.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Bipartition,std::allocator<Bipartition>,boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>&>
                (&local_a0.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Bipartition **)&local_a0,(allocator<Bipartition> *)&local_c1,&local_50);
      PhyloTreeEdge::setOriginalEdge(this_00,&local_a0);
      if (local_a0.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back(local_b8,this_00);
      bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_70);
      if (!bVar2) {
LAB_0011f9da:
        __assert_fail("m_check_invariants()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                      ,0x279,
                      "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                     );
      }
      if (local_70.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_50);
      if (!bVar2) goto LAB_0011f9da;
      if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pPVar1);
  }
  return;
}

Assistant:

PhyloTree::PhyloTree(vector<PhyloTreeEdge> &edges, vector<string> &leaf2NumMap) : leaf2NumMap(leaf2NumMap) {
//    this->leaf2NumMap = leaf2NumMap;
    size_t len = leaf2NumMap.size();
    this->edges.reserve(edges.size());
    for (auto &edge : edges) {
        boost::dynamic_bitset<> new_bitset(len);
        auto partition = edge.getPartition();
        auto plen = partition.size();
        for (size_t i=0; i < len; ++i) {
            new_bitset[len - i - 1] = partition[plen - i - 1];
        }
        edge.setOriginalEdge(make_shared<Bipartition>(new_bitset));
        this->edges.push_back(edge);
    }
}